

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSolvmin.cpp
# Opt level: O2

void __thiscall
chrono::ChOptimizer::Eval_grad(ChOptimizer *this,ChVectorDynamic<> *x,ChVectorDynamic<> *gr)

{
  double dVar1;
  ChFx *pCVar2;
  int iVar3;
  Scalar *pSVar4;
  int mvar;
  long index;
  double dVar5;
  double dVar6;
  ChVectorDynamic<> mdx;
  DenseStorage<double,__1,__1,_1,_0> local_30;
  
  pCVar2 = this->afunctionGrad;
  if (pCVar2 != (ChFx *)0x0) {
    (*(code *)**(undefined8 **)pCVar2)(pCVar2,gr);
    return;
  }
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
            (&local_30,(DenseStorage<double,__1,__1,_1,_0> *)x);
  dVar5 = Eval_fx(this,(ChVectorDynamic<> *)&local_30);
  index = 0;
  while( true ) {
    iVar3 = (*this->_vptr_ChOptimizer[7])(this);
    if (iVar3 <= index) break;
    dVar1 = this->grad_step;
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_30,
                        index);
    *pSVar4 = dVar1 + *pSVar4;
    dVar6 = Eval_fx(this,(ChVectorDynamic<> *)&local_30);
    dVar1 = this->grad_step;
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)gr,index);
    *pSVar4 = (dVar6 - dVar5) / dVar1;
    dVar1 = this->grad_step;
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_30,
                        index);
    index = index + 1;
    *pSVar4 = *pSVar4 - dVar1;
  }
  Eigen::internal::handmade_aligned_free(local_30.m_data);
  return;
}

Assistant:

void ChOptimizer::Eval_grad(const ChVectorDynamic<>& x, ChVectorDynamic<>& gr) {
    // Eval_grad(x->GetAddress(), gr->GetAddress());
    if (afunctionGrad) {
        afunctionGrad->Eval(gr, x);
    } else {
        // otherwise use BDF
        ChVectorDynamic<> mdx = x;

        double mf = Eval_fx(mdx);
        for (int mvar = 0; mvar < GetNumOfVars(); mvar++) {
            mdx(mvar) += grad_step;
            double mfd = Eval_fx(mdx);
            gr(mvar) = (mfd - mf) / (grad_step);
            mdx(mvar) -= grad_step;
        }
    }
}